

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.cc
# Opt level: O2

void __thiscall Monitor::start(Monitor *this)

{
  Monitor *local_30;
  thread local_28;
  code *local_20;
  undefined8 local_18;
  
  local_20 = loop;
  local_18 = 0;
  local_30 = this;
  std::thread::thread<void(Monitor::*)(),Monitor*,void>(&local_28,(type *)&local_20,&local_30);
  std::thread::operator=(&this->thread_,&local_28);
  std::thread::~thread(&local_28);
  pthread_setname_np((this->thread_)._M_id._M_thread,"monitor");
  return;
}

Assistant:

void Monitor::start() {
  thread_ = std::thread(&Monitor::loop, this);
#ifdef __APPLE__
  pthread_setname_np("monitor");
#else
  pthread_setname_np(thread_.native_handle(), "monitor");
#endif
}